

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  ScopedElement *pSVar5;
  element_type *testCaseNode;
  _anonymous_namespace_ *this_00;
  string local_438;
  allocator<char> local_411;
  string local_410 [32];
  undefined1 local_3f0 [16];
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8 [32];
  undefined1 local_398 [24];
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310 [32];
  undefined1 local_2f0 [16];
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268 [32];
  undefined1 local_248 [24];
  string local_230 [32];
  undefined1 local_210 [8];
  ScopedElement properties;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  size_t local_120;
  allocator<char> local_111;
  string local_110;
  unsigned_long local_f0;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  TestGroupStats *local_70;
  TestGroupStats *stats;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ScopedElement e;
  double suiteTime_local;
  TestGroupNode *groupNode_local;
  JunitReporter *this_local;
  
  e._8_8_ = suiteTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"testsuite",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->xml,(XmlFormatting)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70 = &groupNode->value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  XmlWriter::writeAttribute(&this->xml,&local_90,&(local_70->groupInfo).name);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"errors",&local_b9);
  XmlWriter::writeAttribute<unsigned_int>(&this->xml,&local_b8,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"failures",&local_e1);
  local_f0 = (local_70->totals).assertions.failed - (ulong)this->unexpectedExceptions;
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,&local_e0,&local_f0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"tests",&local_111);
  local_120 = Counts::total(&(local_70->totals).assertions);
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,&local_110,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"hostname",&local_141);
  XmlWriter::writeAttribute<char[4]>(&this->xml,&local_140,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"time",&local_169);
    XmlWriter::writeAttribute<char[1]>(&this->xml,&local_168,(char (*) [1])0x23f58f);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  else {
    std::allocator<char>::allocator();
    this_00 = (_anonymous_namespace_ *)0x23f4ef;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"time",&local_191);
    (anonymous_namespace)::formatDuration_abi_cxx11_(&local_1b8,this_00,(double)e._8_8_);
    XmlWriter::writeAttribute(&this->xml,&local_190,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"timestamp",&local_1d9);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  XmlWriter::writeAttribute(&this->xml,&local_1d8,(string *)&properties.m_fmt);
  std::__cxx11::string::~string((string *)&properties.m_fmt);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
    iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_0014640b;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"properties",(allocator<char> *)(local_248 + 0x17));
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_210,(string *)&this->xml,(XmlFormatting)local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)(local_248 + 0x17));
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_268,"property",&local_269);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_248,(string *)&this->xml,(XmlFormatting)local_268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"name",&local_291);
    pSVar5 = XmlWriter::ScopedElement::writeAttribute<char[8]>
                       ((ScopedElement *)local_248,&local_290,(char (*) [8])"filters");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"value",&local_2b9);
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
    iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)(local_2f0 + 0x10),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
              (pSVar5,&local_2b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_2f0 + 0x10));
    std::__cxx11::string::~string((string *)(local_2f0 + 0x10));
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_248);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator(&local_269);
  }
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_310,"property",&local_311);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_2f0,(string *)&this->xml,(XmlFormatting)local_310);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"name",&local_339);
    pSVar5 = XmlWriter::ScopedElement::writeAttribute<char[12]>
                       ((ScopedElement *)local_2f0,&local_338,(char (*) [12])"random-seed");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"value",(allocator<char> *)((long)&__range1 + 7));
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
    __range1._0_4_ = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>(pSVar5,&local_360,(uint *)&__range1);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2f0);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator(&local_311);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_210);
LAB_0014640b:
  __end1 = clara::std::
           vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ::begin(&groupNode->children);
  child = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
           *)clara::std::
             vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
             ::end(&groupNode->children);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                                     *)&child), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_398._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
         ::operator*(&__end1);
    testCaseNode = clara::std::
                   __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_398._16_8_);
    writeTestCase(this,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"system-out",&local_3b9);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_398,(string *)&this->xml,(XmlFormatting)local_3b8);
  trim((string *)(local_3f0 + 0x10),&this->stdOutForSuite);
  XmlWriter::ScopedElement::writeText
            ((ScopedElement *)local_398,(string *)(local_3f0 + 0x10),Newline);
  std::__cxx11::string::~string((string *)(local_3f0 + 0x10));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_398);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"system-err",&local_411);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_3f0,(string *)&this->xml,(XmlFormatting)local_410);
  trim(&local_438,&this->stdErrForSuite);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_3f0,&local_438,Newline);
  std::__cxx11::string::~string((string *)&local_438);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_3f0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }